

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

int Str_MuxToGia_rec(Gia_Man_t *pNew,Str_Mux_t *pMux,int i,Vec_Int_t *vDelay)

{
  int iVar1;
  int iLit1_00;
  Str_Mux_t *pMux_00;
  int iLit1;
  int iLit0;
  Str_Mux_t *pFanin;
  Vec_Int_t *vDelay_local;
  int i_local;
  Str_Mux_t *pMux_local;
  Gia_Man_t *pNew_local;
  
  if (0 < pMux->Edge[i].Fan) {
    pMux_00 = Str_MuxFanin(pMux,i);
    iVar1 = Str_MuxToGia_rec(pNew,pMux_00,0,vDelay);
    iLit1_00 = Str_MuxToGia_rec(pNew,pMux_00,1,vDelay);
    if (0 < pMux_00->Edge[2].Fan) {
      __assert_fail("pFanin->Edge[2].Fan <= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                    ,0x5fc,"int Str_MuxToGia_rec(Gia_Man_t *, Str_Mux_t *, int, Vec_Int_t *)");
    }
    if (pMux_00->Edge[2].fCompl != 0) {
      __assert_fail("pFanin->Edge[2].fCompl == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                    ,0x5fd,"int Str_MuxToGia_rec(Gia_Man_t *, Str_Mux_t *, int, Vec_Int_t *)");
    }
    iVar1 = Gia_ManHashMuxReal(pNew,pMux_00->Edge[2].Copy,iLit1_00,iVar1);
    pMux->Edge[i].Copy = iVar1;
    iVar1 = Abc_Lit2Var(pMux->Edge[i].Copy);
    Str_ObjDelay(pNew,iVar1,pMux_00->nLutSize,vDelay);
  }
  iVar1 = Abc_LitNotCond(pMux->Edge[i].Copy,pMux->Edge[i].fCompl);
  return iVar1;
}

Assistant:

int Str_MuxToGia_rec( Gia_Man_t * pNew, Str_Mux_t * pMux, int i, Vec_Int_t * vDelay )
{
    if ( pMux->Edge[i].Fan > 0 )
    {
        Str_Mux_t * pFanin = Str_MuxFanin( pMux, i );
        int iLit0 = Str_MuxToGia_rec( pNew, pFanin, 0, vDelay );
        int iLit1 = Str_MuxToGia_rec( pNew, pFanin, 1, vDelay );
        assert( pFanin->Edge[2].Fan <= 0 );
        assert( pFanin->Edge[2].fCompl == 0 );
        pMux->Edge[i].Copy = Gia_ManHashMuxReal( pNew, pFanin->Edge[2].Copy, iLit1, iLit0 );
        Str_ObjDelay( pNew, Abc_Lit2Var(pMux->Edge[i].Copy), pFanin->nLutSize, vDelay );
    }
    return Abc_LitNotCond( pMux->Edge[i].Copy, pMux->Edge[i].fCompl );
}